

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_resize(HSQUIRRELVM v)

{
  SQInteger SVar1;
  HSQUIRRELVM in_RDI;
  SQObjectPtr fill;
  SQObject *nsize;
  SQObject *o;
  SQChar *in_stack_ffffffffffffff98;
  HSQUIRRELVM in_stack_ffffffffffffffa0;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQArray *in_stack_ffffffffffffffb0;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  SQObjectPtr *local_18;
  HSQUIRRELVM local_10;
  SQRESULT local_8;
  
  local_10 = in_RDI;
  local_18 = stack_get(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
  local_20 = stack_get(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
  SQObjectPtr::SQObjectPtr(&local_30);
  if (((local_20->super_SQObject)._type & 0x4000000) == 0) {
    local_8 = sq_throwerror(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    SVar1 = sq_gettop(local_10);
    if (2 < SVar1) {
      in_stack_ffffffffffffffb0 =
           (SQArray *)stack_get(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
      SQObjectPtr::operator=((SQObjectPtr *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    if ((local_20->super_SQObject)._type == OT_FLOAT) {
      in_stack_ffffffffffffffa0 = (HSQUIRRELVM)(long)(local_20->super_SQObject)._unVal.fFloat;
    }
    else {
      in_stack_ffffffffffffffa0 = (HSQUIRRELVM)(local_20->super_SQObject)._unVal.pTable;
    }
    SQArray::Resize(in_stack_ffffffffffffffb0,(local_18->super_SQObject)._unVal.nInteger,
                    (SQObjectPtr *)in_stack_ffffffffffffffa0);
    local_8 = 0;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  return local_8;
}

Assistant:

static SQInteger array_resize(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &nsize = stack_get(v, 2);
    SQObjectPtr fill;
    if(sq_isnumeric(nsize)) {
        if(sq_gettop(v) > 2)
            fill = stack_get(v, 3);
        _array(o)->Resize(tointeger(nsize),fill);
        return 0;
    }
    return sq_throwerror(v, _SC("size must be a number"));
}